

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall SslTcpSocketImpl::ConEstablished(SslTcpSocketImpl *this,TcpSocketImpl *param_1)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  int iResult;
  uint __val;
  size_t __n;
  pointer szBuffer;
  SSL *__val_00;
  bool bVar2;
  unique_lock<std::mutex> lock;
  size_t len;
  __array temp;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  wstring local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  wstring local_50;
  
  OpenSSLWrapper::SslConnection::SSLSetConnectState
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  iResult = OpenSSLWrapper::SslConnection::SSLDoHandshake
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  this->m_iSslInit = iResult;
  if ((iResult < 1) &&
     (__val = OpenSSLWrapper::SslConnection::SSLGetError
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,iResult), __val != 2)) {
    (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iError = __val | 0x80000000;
    (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
    std::__cxx11::to_wstring(&local_50,__val);
    std::operator+(&local_70,L"SSL_error after SSL_Handshake: ",&local_50);
    std::operator+(&local_d0,&local_70,L" on ssl context: ");
    __val_00 = OpenSSLWrapper::SslConnection::operator()
                         ((this->m_pSslCon)._M_t.
                          super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                          .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                          _M_head_impl);
    std::__cxx11::to_wstring(&local_90,(unsigned_long)__val_00);
    std::operator+(&local_b0,&local_d0,&local_90);
    std::operator+(&local_f0,&local_b0,L"\r\n");
    OutputDebugString(local_f0._M_dataplus._M_p);
    std::__cxx11::wstring::~wstring((wstring *)&local_f0);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    std::__cxx11::wstring::~wstring((wstring *)&local_90);
    std::__cxx11::wstring::~wstring((wstring *)&local_d0);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
    return;
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&local_f0,&this->m_mxEnDecode);
  __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                  ((this->m_pSslCon)._M_t.
                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  __mutex = &(this->super_TcpSocketImpl).m_mxOutDeque;
  bVar2 = false;
  while (__n != 0) {
    szBuffer = (pointer)operator_new__(__n);
    memset(szBuffer,0,__n);
    local_b0._M_dataplus._M_p = szBuffer;
    local_d0._M_dataplus._M_p =
         (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl,(uint8_t *)szBuffer,__n);
    if (local_d0._M_dataplus._M_p != (pointer)0x0) {
      std::mutex::lock(__mutex);
      LOCK();
      paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_d0._M_dataplus._M_p;
      UNLOCK();
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&(this->super_TcpSocketImpl).m_quOutData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_b0,
                 (unsigned_long *)&local_d0);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      bVar2 = true;
    }
    __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                    ((this->m_pSslCon)._M_t.
                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_b0);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&local_f0);
  if (bVar2) {
    TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_f0);
  return;
}

Assistant:

void SslTcpSocketImpl::ConEstablished(const TcpSocketImpl* const /*pTcpSocket*/)
{
    m_pSslCon->SSLSetConnectState();

    m_iSslInit = m_pSslCon->SSLDoHandshake();
    if (m_iSslInit <= 0)
    {
        const int iError = m_pSslCon->SSLGetError(m_iSslInit);
        if (iError != SSL_ERROR_WANT_READ)
        {
            m_iError = 0x80000000 | iError;
            m_iErrLoc = 15;
            OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
            Close();
            return;
        }
    }

    bool bNewData = false;
    unique_lock<mutex> lock(m_mxEnDecode);
    size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
    while (nOutDataSize > 0)
    {
        auto temp = make_unique<uint8_t[]>(nOutDataSize);
        size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
        // Schreibt Daten in die SOCKET
        if (len > 0)
        {
            m_mxOutDeque.lock();
            m_atOutBytes += len;
            m_quOutData.emplace_back(move(temp), len);
            m_mxOutDeque.unlock();
            bNewData = true;
        }
        nOutDataSize = m_pSslCon->SslGetOutDataSize();
    }
    lock.unlock();

    if (bNewData == true)
        TriggerWriteThread();
}